

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaParser::ReadMetaDataItem(ColladaParser *this,StringMetaData *metadata)

{
  pointer ppVar1;
  int iVar2;
  ai_uint32 aVar3;
  MetaKeyPairVector *pMVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  size_type *psVar10;
  bool bVar11;
  string camel_key_str;
  string key_str;
  aiString aistr;
  string local_480;
  long *local_460;
  long local_458;
  long local_450 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_440;
  aiString local_434;
  
  pMVar4 = Collada::GetColladaAssimpMetaKeysCamelCase_abi_cxx11_();
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  pcVar6 = (char *)CONCAT44(extraout_var,iVar2);
  if (pcVar6 == (char *)0x0) {
    SkipElement(this);
    return;
  }
  local_460 = local_450;
  sVar5 = strlen(pcVar6);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,pcVar6,pcVar6 + sVar5);
  pcVar6 = TestTextContent(this);
  if (pcVar6 != (char *)0x0) {
    local_434.length = 0;
    local_434.data[0] = '\0';
    memset(local_434.data + 1,0x1b,0x3ff);
    sVar5 = strlen(pcVar6);
    aVar3 = (ai_uint32)sVar5;
    if ((int)aVar3 < 0x400) {
      local_434.length = aVar3;
      memcpy(local_434.data,pcVar6,(long)(int)aVar3);
      local_434.data[(int)aVar3] = '\0';
    }
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_480,local_460,(long)local_460 + local_458);
    Collada::ToCamelCase(&local_480);
    ppVar1 = (pMVar4->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(pMVar4->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
    bVar11 = lVar8 != 0;
    uVar9 = 0xffffffffffffffff;
    if (bVar11) {
      uVar9 = lVar8 >> 6;
      local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_480._M_dataplus._M_p;
      psVar10 = &(ppVar1->first)._M_string_length;
      bVar11 = true;
      uVar7 = 0;
      do {
        sVar5 = *psVar10;
        if ((sVar5 == local_480._M_string_length) &&
           ((sVar5 == 0 ||
            (iVar2 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (psVar10 + -1))->_M_dataplus)._M_p,local_440,sVar5), iVar2 == 0)))) {
          uVar9 = 0xffffffffffffffff;
          if (bVar11) {
            uVar9 = uVar7;
          }
          goto LAB_00433a10;
        }
        uVar7 = uVar7 + 1;
        bVar11 = uVar7 < uVar9;
        psVar10 = psVar10 + 8;
      } while (uVar9 + (uVar9 == 0) != uVar7);
      uVar9 = 0xffffffffffffffff;
    }
LAB_00433a10:
    if (bVar11) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,aiString&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                  *)metadata,&ppVar1[uVar9].second,&local_434);
    }
    else {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
      ::_M_emplace_unique<std::__cxx11::string&,aiString&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                  *)metadata,&local_480,&local_434);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
    }
  }
  TestClosing(this,(char *)local_460);
  if (local_460 != local_450) {
    operator_delete(local_460,local_450[0] + 1);
  }
  return;
}

Assistant:

void ColladaParser::ReadMetaDataItem(StringMetaData &metadata) {
    const Collada::MetaKeyPairVector &key_renaming = GetColladaAssimpMetaKeysCamelCase();
	// Metadata such as created, keywords, subject etc
	const char *key_char = mReader->getNodeName();
	if (key_char != nullptr) {
        const std::string key_str(key_char);
		const char *value_char = TestTextContent();
		if (value_char != nullptr) {
            aiString aistr;
			aistr.Set(value_char);

            std::string camel_key_str(key_str);
			ToCamelCase(camel_key_str);

			size_t found_index;
			if (FindCommonKey(camel_key_str, key_renaming, found_index)) {
                metadata.emplace(key_renaming[found_index].second, aistr);
            } else {
				metadata.emplace(camel_key_str, aistr);
			}
        }
        TestClosing(key_str.c_str());
    }
    else
        SkipElement();
}